

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# damerau_levenshtein_distance.cc
# Opt level: O0

uint8_t absl::strings_internal::CappedDamerauLevenshteinDistance
                  (string_view s1,string_view s2,uint8_t cutoff)

{
  char cVar1;
  initializer_list<unsigned_char> __l;
  size_t sVar2;
  bool bVar3;
  value_type_conflict1 vVar4;
  uchar uVar5;
  uchar *puVar6;
  size_type sVar7;
  size_type sVar8;
  reference pvVar9;
  iterator __first;
  iterator pvVar10;
  reference pvVar11;
  ulong uVar12;
  const_reference pvVar13;
  uchar local_291d;
  char local_291c;
  char local_291b;
  char local_291a;
  char local_2919;
  iterator local_2918;
  undefined8 local_2910;
  char local_2905;
  char local_2904;
  char local_2903;
  char local_2902;
  char local_2901;
  uint8_t transposition_distance;
  uint8_t mismatch_distance;
  uint8_t mismatched_tail_cost;
  uint8_t insertion_distance;
  ulong uStack_2900;
  uint8_t deletion_distance;
  size_t j;
  size_t j_end;
  size_t j_begin;
  size_t i;
  array<std::array<unsigned_char,_102UL>,_102UL> d;
  uint8_t upper_diag;
  uint8_t lower_diag;
  uint8_t cutoff_plus_1;
  uint8_t _cutoff;
  uint8_t MAX_SIZE;
  uint8_t cutoff_local;
  string_view s2_local;
  string_view s1_local;
  
  s2_local._M_len = (size_t)s2._M_str;
  register0x00000010 = s2._M_len;
  s2_local._M_str = (char *)s1._M_len;
  d._M_elems[0x65]._M_elems[0x62] = 'd';
  d._M_elems[0x65]._M_elems[99] = cutoff;
  puVar6 = std::min<unsigned_char>(d._M_elems[0x65]._M_elems + 0x62,d._M_elems[0x65]._M_elems + 99);
  d._M_elems[0x65]._M_elems[0x61] = *puVar6;
  d._M_elems[0x65]._M_elems[0x60] = d._M_elems[0x65]._M_elems[0x61] + '\x01';
  sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&s2_local._M_str);
  sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     (d._M_elems[0x65]._M_elems + 100));
  if (sVar8 < sVar7) {
    std::swap<std::basic_string_view<char,std::char_traits<char>>>
              ((basic_string_view<char,_std::char_traits<char>_> *)&s2_local._M_str,
               (basic_string_view<char,_std::char_traits<char>_> *)(d._M_elems[0x65]._M_elems + 100)
              );
  }
  sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&s2_local._M_str);
  uVar12 = (ulong)d._M_elems[0x65]._M_elems[0x61];
  sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     (d._M_elems[0x65]._M_elems + 100));
  if ((sVar7 + uVar12 < sVar8) ||
     (sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         (d._M_elems[0x65]._M_elems + 100)), 100 < sVar7)) {
    s1_local._M_str._7_1_ = d._M_elems[0x65]._M_elems[0x60];
  }
  else {
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&s2_local._M_str);
    uVar5 = d._M_elems[0x65]._M_elems[0x61];
    if (bVar3) {
      sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         (d._M_elems[0x65]._M_elems + 100));
      s1_local._M_str._7_1_ = (uint8_t)sVar7;
    }
    else {
      sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         (d._M_elems[0x65]._M_elems + 100));
      sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&s2_local._M_str);
      d._M_elems[0x65]._M_elems[0x5f] = uVar5 - ((char)sVar7 - (char)sVar8);
      d._M_elems[0x65]._M_elems[0x5e] = d._M_elems[0x65]._M_elems[0x61];
      pvVar9 = std::array<std::array<unsigned_char,_102UL>,_102UL>::operator[]
                         ((array<std::array<unsigned_char,_102UL>,_102UL> *)((long)&i + 6),0);
      __first = std::array<unsigned_char,_102UL>::begin(pvVar9);
      pvVar9 = std::array<std::array<unsigned_char,_102UL>,_102UL>::operator[]
                         ((array<std::array<unsigned_char,_102UL>,_102UL> *)((long)&i + 6),0);
      pvVar10 = std::array<unsigned_char,_102UL>::begin(pvVar9);
      std::iota<unsigned_char*,int>
                (__first,pvVar10 + (long)(int)(uint)d._M_elems[0x65]._M_elems[0x5e] + 1,0);
      uVar5 = d._M_elems[0x65]._M_elems[0x60];
      pvVar9 = std::array<std::array<unsigned_char,_102UL>,_102UL>::operator[]
                         ((array<std::array<unsigned_char,_102UL>,_102UL> *)((long)&i + 6),0);
      pvVar11 = std::array<unsigned_char,_102UL>::operator[]
                          (pvVar9,(ulong)d._M_elems[0x65]._M_elems[0x60]);
      *pvVar11 = uVar5;
      for (j_begin = 1; sVar2 = j_begin,
          sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)&s2_local._M_str),
          uVar5 = d._M_elems[0x65]._M_elems[0x60], sVar2 <= sVar7; j_begin = j_begin + 1) {
        j_end = 1;
        if (d._M_elems[0x65]._M_elems[0x5f] < j_begin) {
          j_end = j_begin - d._M_elems[0x65]._M_elems[0x5f];
          pvVar9 = std::array<std::array<unsigned_char,_102UL>,_102UL>::operator[]
                             ((array<std::array<unsigned_char,_102UL>,_102UL> *)((long)&i + 6),
                              j_begin);
          pvVar11 = std::array<unsigned_char,_102UL>::operator[](pvVar9,j_end - 1);
          *pvVar11 = uVar5;
        }
        else {
          vVar4 = (value_type_conflict1)j_begin;
          pvVar9 = std::array<std::array<unsigned_char,_102UL>,_102UL>::operator[]
                             ((array<std::array<unsigned_char,_102UL>,_102UL> *)((long)&i + 6),
                              j_begin);
          pvVar11 = std::array<unsigned_char,_102UL>::operator[](pvVar9,0);
          *pvVar11 = vVar4;
        }
        uVar12 = j_begin + d._M_elems[0x65]._M_elems[0x5e];
        j = uVar12;
        sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           (d._M_elems[0x65]._M_elems + 100));
        uVar5 = d._M_elems[0x65]._M_elems[0x60];
        if (sVar7 < uVar12) {
          j = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         (d._M_elems[0x65]._M_elems + 100));
        }
        else {
          pvVar9 = std::array<std::array<unsigned_char,_102UL>,_102UL>::operator[]
                             ((array<std::array<unsigned_char,_102UL>,_102UL> *)((long)&i + 6),
                              j_begin);
          pvVar11 = std::array<unsigned_char,_102UL>::operator[](pvVar9,j + 1);
          *pvVar11 = uVar5;
        }
        for (uStack_2900 = j_end; uStack_2900 <= j; uStack_2900 = uStack_2900 + 1) {
          pvVar9 = std::array<std::array<unsigned_char,_102UL>,_102UL>::operator[]
                             ((array<std::array<unsigned_char,_102UL>,_102UL> *)((long)&i + 6),
                              j_begin - 1);
          pvVar11 = std::array<unsigned_char,_102UL>::operator[](pvVar9,uStack_2900);
          local_2901 = *pvVar11 + '\x01';
          pvVar9 = std::array<std::array<unsigned_char,_102UL>,_102UL>::operator[]
                             ((array<std::array<unsigned_char,_102UL>,_102UL> *)((long)&i + 6),
                              j_begin);
          pvVar11 = std::array<unsigned_char,_102UL>::operator[](pvVar9,uStack_2900 - 1);
          local_2902 = *pvVar11 + '\x01';
          pvVar13 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                              ((basic_string_view<char,_std::char_traits<char>_> *)&s2_local._M_str,
                               j_begin - 1);
          cVar1 = *pvVar13;
          pvVar13 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                              ((basic_string_view<char,_std::char_traits<char>_> *)
                               (d._M_elems[0x65]._M_elems + 100),uStack_2900 - 1);
          local_2903 = cVar1 != *pvVar13;
          pvVar9 = std::array<std::array<unsigned_char,_102UL>,_102UL>::operator[]
                             ((array<std::array<unsigned_char,_102UL>,_102UL> *)((long)&i + 6),
                              j_begin - 1);
          pvVar11 = std::array<unsigned_char,_102UL>::operator[](pvVar9,uStack_2900 - 1);
          local_2904 = *pvVar11 + local_2903;
          local_2905 = d._M_elems[0x65]._M_elems[0x61] + '\x01';
          if ((1 < j_begin) && (1 < uStack_2900)) {
            pvVar13 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                ((basic_string_view<char,_std::char_traits<char>_> *)
                                 &s2_local._M_str,j_begin - 1);
            cVar1 = *pvVar13;
            pvVar13 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                ((basic_string_view<char,_std::char_traits<char>_> *)
                                 (d._M_elems[0x65]._M_elems + 100),uStack_2900 - 2);
            if (cVar1 == *pvVar13) {
              pvVar13 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                  ((basic_string_view<char,_std::char_traits<char>_> *)
                                   &s2_local._M_str,j_begin - 2);
              cVar1 = *pvVar13;
              pvVar13 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                                  ((basic_string_view<char,_std::char_traits<char>_> *)
                                   (d._M_elems[0x65]._M_elems + 100),uStack_2900 - 1);
              if (cVar1 == *pvVar13) {
                pvVar9 = std::array<std::array<unsigned_char,_102UL>,_102UL>::operator[]
                                   ((array<std::array<unsigned_char,_102UL>,_102UL> *)((long)&i + 6)
                                    ,j_begin - 2);
                pvVar11 = std::array<unsigned_char,_102UL>::operator[](pvVar9,uStack_2900 - 2);
                local_2905 = *pvVar11 + '\x01';
              }
            }
          }
          local_291d = d._M_elems[0x65]._M_elems[0x60];
          local_291c = local_2901;
          local_291b = local_2902;
          local_291a = local_2904;
          local_2919 = local_2905;
          local_2918 = &local_291d;
          local_2910 = 5;
          __l._M_len = 5;
          __l._M_array = local_2918;
          uVar5 = std::min<unsigned_char>(__l);
          pvVar9 = std::array<std::array<unsigned_char,_102UL>,_102UL>::operator[]
                             ((array<std::array<unsigned_char,_102UL>,_102UL> *)((long)&i + 6),
                              j_begin);
          pvVar11 = std::array<unsigned_char,_102UL>::operator[](pvVar9,uStack_2900);
          *pvVar11 = uVar5;
        }
      }
      sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&s2_local._M_str);
      pvVar9 = std::array<std::array<unsigned_char,_102UL>,_102UL>::operator[]
                         ((array<std::array<unsigned_char,_102UL>,_102UL> *)((long)&i + 6),sVar7);
      sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         (d._M_elems[0x65]._M_elems + 100));
      pvVar11 = std::array<unsigned_char,_102UL>::operator[](pvVar9,sVar7);
      s1_local._M_str._7_1_ = *pvVar11;
    }
  }
  return s1_local._M_str._7_1_;
}

Assistant:

uint8_t CappedDamerauLevenshteinDistance(absl::string_view s1,
                                         absl::string_view s2, uint8_t cutoff) {
  const uint8_t MAX_SIZE = 100;
  const uint8_t _cutoff = std::min(MAX_SIZE, cutoff);
  const uint8_t cutoff_plus_1 = static_cast<uint8_t>(_cutoff + 1);

  if (s1.size() > s2.size()) std::swap(s1, s2);
  if (s1.size() + _cutoff < s2.size() || s2.size() > MAX_SIZE)
    return cutoff_plus_1;

  if (s1.empty())
    return static_cast<uint8_t>(s2.size());

  // Lower diagonal bound: y = x - lower_diag
  const uint8_t lower_diag =
      _cutoff - static_cast<uint8_t>(s2.size() - s1.size());
  // Upper diagonal bound: y = x + upper_diag
  const uint8_t upper_diag = _cutoff;

  // d[i][j] is the number of edits required to convert s1[0, i] to s2[0, j]
  std::array<std::array<uint8_t, MAX_SIZE + 2>, MAX_SIZE + 2> d;
  std::iota(d[0].begin(), d[0].begin() + upper_diag + 1, 0);
  d[0][cutoff_plus_1] = cutoff_plus_1;
  for (size_t i = 1; i <= s1.size(); ++i) {
    // Deduce begin of relevant window.
    size_t j_begin = 1;
    if (i > lower_diag) {
      j_begin = i - lower_diag;
      d[i][j_begin - 1] = cutoff_plus_1;
    } else {
      d[i][0] = static_cast<uint8_t>(i);
    }

    // Deduce end of relevant window.
    size_t j_end = i + upper_diag;
    if (j_end > s2.size()) {
      j_end = s2.size();
    } else {
      d[i][j_end + 1] = cutoff_plus_1;
    }

    for (size_t j = j_begin; j <= j_end; ++j) {
      const uint8_t deletion_distance = d[i - 1][j] + 1;
      const uint8_t insertion_distance = d[i][j - 1] + 1;
      const uint8_t mismatched_tail_cost = s1[i - 1] == s2[j - 1] ? 0 : 1;
      const uint8_t mismatch_distance = d[i - 1][j - 1] + mismatched_tail_cost;
      uint8_t transposition_distance = _cutoff + 1;
      if (i > 1 && j > 1 && s1[i - 1] == s2[j - 2] && s1[i - 2] == s2[j - 1])
        transposition_distance = d[i - 2][j - 2] + 1;
      d[i][j] = std::min({cutoff_plus_1, deletion_distance, insertion_distance,
                          mismatch_distance, transposition_distance});
    }
  }
  return d[s1.size()][s2.size()];
}